

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O2

string * build_repetition(string *__return_storage_ptr__,string *item_rule,int min_items,
                         int max_items,string *separator_rule)

{
  int min_items_00;
  char *__rhs;
  string *this;
  allocator<char> local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if (max_items == 1 && min_items == 0) {
    __rhs = "?";
  }
  else {
    if (separator_rule->_M_string_length != 0) {
      std::operator+(&local_e8,item_rule," ");
      std::operator+(&local_c8,"(",separator_rule);
      std::operator+(&local_a8,&local_c8," ");
      std::operator+(&local_88,&local_a8,item_rule);
      std::operator+(&local_68,&local_88,")");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_109);
      min_items_00 = min_items + -1;
      if (min_items == 0) {
        min_items_00 = 0;
      }
      build_repetition(&local_108,&local_68,min_items_00,max_items - (uint)(max_items != 0x7fffffff)
                       ,&local_48);
      std::operator+(__return_storage_ptr__,&local_e8,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      if (min_items != 0) {
        return __return_storage_ptr__;
      }
      std::operator+(&local_108,"(",__return_storage_ptr__);
      std::operator+(&local_e8,&local_108,")?");
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      this = &local_108;
LAB_001bcab2:
      std::__cxx11::string::~string((string *)this);
      return __return_storage_ptr__;
    }
    if (min_items == 1 && (max_items ^ 0x7fffffffU) == 0) {
      __rhs = "+";
    }
    else {
      if ((max_items ^ 0x7fffffffU) != 0 || min_items != 0) {
        std::operator+(&local_88,item_rule,"{");
        std::__cxx11::to_string(&local_a8,min_items);
        std::operator+(&local_68,&local_88,&local_a8);
        std::operator+(&local_108,&local_68,",");
        if (max_items == 0x7fffffff) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"",(allocator<char> *)&local_48);
        }
        else {
          std::__cxx11::to_string(&local_c8,max_items);
        }
        std::operator+(&local_e8,&local_108,&local_c8);
        std::operator+(__return_storage_ptr__,&local_e8,"}");
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_a8);
        this = &local_88;
        goto LAB_001bcab2;
      }
      __rhs = "*";
    }
  }
  std::operator+(__return_storage_ptr__,item_rule,__rhs);
  return __return_storage_ptr__;
}

Assistant:

static std::string build_repetition(const std::string & item_rule, int min_items, int max_items, const std::string & separator_rule = "") {
    auto has_max = max_items != std::numeric_limits<int>::max();

    if (min_items == 0 && max_items == 1) {
        return item_rule + "?";
    }

    if (separator_rule.empty()) {
        if (min_items == 1 && !has_max) {
            return item_rule + "+";
        } else if (min_items == 0 && !has_max) {
            return item_rule + "*";
        } else {
            return item_rule + "{" + std::to_string(min_items) + "," + (has_max ? std::to_string(max_items) : "") + "}";
        }
    }

    auto result = item_rule + " " + build_repetition("(" + separator_rule + " " + item_rule + ")", min_items == 0 ? 0 : min_items - 1, has_max ? max_items - 1 : max_items);
    if (min_items == 0) {
        result = "(" + result + ")?";
    }
    return result;
}